

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

ssize_t __thiscall
nestl::impl::list<int,_nestl::allocator<int>_>::splice
          (list<int,_nestl::allocator<int>_> *this,int __fdin,__off64_t *__offin,int __fdout,
          __off64_t *__offout,size_t __len,uint __flags)

{
  bool bVar1;
  list_node_base *node;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ssize_t extraout_RAX;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  iterator j;
  list_iterator<int> local_40;
  list_const_iterator<int> local_38;
  list_const_iterator<int> local_30;
  list_const_iterator<int> local_28;
  ssize_t sVar2;
  
  local_38.m_node = (list_node_base *)CONCAT44(in_register_00000034,__fdin);
  local_30.m_node = (list_node_base *)CONCAT44(in_register_0000000c,__fdout);
  node = list_const_iterator<int>::get_list_node(&local_30);
  list_iterator<int>::list_iterator(&local_40,node);
  list_iterator<int>::operator++(&local_40);
  bVar1 = list_const_iterator<int>::operator==(&local_38,&local_30);
  sVar2 = CONCAT71(extraout_var,bVar1);
  if (!bVar1) {
    list_const_iterator<int>::list_const_iterator(&local_28,&local_40);
    bVar1 = list_const_iterator<int>::operator==(&local_38,&local_28);
    sVar2 = CONCAT71(extraout_var_00,bVar1);
    if (!bVar1) {
      list<int,nestl::allocator<int>>::
      transfer<nestl::impl::list_const_iterator<int>,nestl::impl::list_const_iterator<int>,nestl::impl::list_iterator<int>>
                ((list<int,nestl::allocator<int>> *)this,local_38,local_30,local_40);
      sVar2 = extraout_RAX;
    }
  }
  return sVar2;
}

Assistant:

void
list<T, A>::splice(const_iterator pos, list&& /* other */, const_iterator it) NESTL_NOEXCEPT_SPEC
{
    iterator j = iterator(it.get_list_node());
    ++j;
    if ((pos == it) || (pos == j))
    {
        return;
    }

    this->transfer(pos, it, j);
}